

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_sphere_wires(rf_vec3 center_pos,float radius,int rings,int slices,rf_color color)

{
  ulong uVar1;
  _Bool _Var2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float __x;
  undefined4 local_58;
  undefined4 uStack_54;
  
  uVar4 = rings + 2;
  _Var2 = rf_gfx_check_buffer_limit(slices * uVar4 * 6);
  if (_Var2) {
    rf_gfx_draw();
  }
  rf_gfx_push_matrix();
  local_58 = center_pos.x;
  uStack_54 = center_pos.y;
  rf_gfx_translatef(local_58,uStack_54,center_pos.z);
  rf_gfx_scalef(radius,radius,radius);
  rf_gfx_begin(RF_LINES);
  rf_gfx_color4ub(color.r,color.g,color.b,color.a);
  lVar6 = (long)slices;
  lVar3 = 0;
  if (0 < lVar6) {
    lVar3 = lVar6;
  }
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  uVar1 = 0;
  while (uVar5 = uVar1, uVar5 != uVar4) {
    lVar7 = 0;
    while (uVar1 = uVar5 + 1, lVar3 * 0x168 != lVar7) {
      lVar8 = (long)(int)(0xb4 / (long)(rings + 1));
      __x = (float)(long)(uVar5 * lVar8 + 0x10e) * 0.017453292;
      fVar9 = cosf(__x);
      fVar10 = (float)(lVar7 / lVar6) * 0.017453292;
      fVar11 = sinf(fVar10);
      fVar12 = sinf(__x);
      fVar13 = cosf(__x);
      fVar14 = cosf(fVar10);
      rf_gfx_vertex3f(fVar11 * fVar9,fVar12,fVar13 * fVar14);
      fVar9 = (float)(long)(lVar8 * (uVar5 + 1) + 0x10e) * 0.017453292;
      fVar11 = cosf(fVar9);
      lVar7 = lVar7 + 0x168;
      fVar12 = (float)(lVar7 / lVar6) * 0.017453292;
      fVar13 = sinf(fVar12);
      fVar14 = sinf(fVar9);
      fVar15 = cosf(fVar9);
      fVar16 = cosf(fVar12);
      rf_gfx_vertex3f(fVar13 * fVar11,fVar14,fVar15 * fVar16);
      fVar11 = cosf(fVar9);
      fVar13 = sinf(fVar12);
      fVar14 = sinf(fVar9);
      fVar15 = cosf(fVar9);
      fVar12 = cosf(fVar12);
      rf_gfx_vertex3f(fVar13 * fVar11,fVar14,fVar15 * fVar12);
      fVar11 = cosf(fVar9);
      fVar12 = sinf(fVar10);
      fVar13 = sinf(fVar9);
      fVar14 = cosf(fVar9);
      fVar15 = cosf(fVar10);
      rf_gfx_vertex3f(fVar12 * fVar11,fVar13,fVar14 * fVar15);
      fVar11 = cosf(fVar9);
      fVar12 = sinf(fVar10);
      fVar13 = sinf(fVar9);
      fVar9 = cosf(fVar9);
      fVar14 = cosf(fVar10);
      rf_gfx_vertex3f(fVar12 * fVar11,fVar13,fVar9 * fVar14);
      fVar9 = cosf(__x);
      fVar11 = sinf(fVar10);
      fVar12 = sinf(__x);
      fVar13 = cosf(__x);
      fVar10 = cosf(fVar10);
      rf_gfx_vertex3f(fVar11 * fVar9,fVar12,fVar13 * fVar10);
    }
  }
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_sphere_wires(rf_vec3 center_pos, float radius, int rings, int slices, rf_color color)
{
    int num_vertex = (rings + 2)*slices*6;
    if (rf_gfx_check_buffer_limit(num_vertex)) rf_gfx_draw();

    rf_gfx_push_matrix();
    // NOTE: Transformation is applied in inverse order (scale -> translate)
    rf_gfx_translatef(center_pos.x, center_pos.y, center_pos.z);
    rf_gfx_scalef(radius, radius, radius);

    rf_gfx_begin(RF_LINES);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);

    for (rf_int i = 0; i < (rings + 2); i++)
    {
        for (rf_int j = 0; j < slices; j++)
        {
            rf_gfx_vertex3f(cosf(RF_DEG2RAD*(270+(180/(rings + 1))*i))*sinf(RF_DEG2RAD*(j * 360/slices)),
                           sinf(RF_DEG2RAD*(270+(180/(rings + 1))*i)),
                           cosf(RF_DEG2RAD*(270+(180/(rings + 1))*i))*cosf(RF_DEG2RAD*(j * 360/slices)));
            rf_gfx_vertex3f(cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*sinf(RF_DEG2RAD*((j+1) * 360/slices)),
                           sinf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1))),
                           cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*cosf(RF_DEG2RAD*((j+1) * 360/slices)));

            rf_gfx_vertex3f(cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*sinf(RF_DEG2RAD*((j+1) * 360/slices)),
                           sinf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1))),
                           cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*cosf(RF_DEG2RAD*((j+1) * 360/slices)));
            rf_gfx_vertex3f(cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*sinf(RF_DEG2RAD*(j * 360/slices)),
                           sinf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1))),
                           cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*cosf(RF_DEG2RAD*(j * 360/slices)));

            rf_gfx_vertex3f(cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*sinf(RF_DEG2RAD*(j * 360/slices)),
                           sinf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1))),
                           cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*cosf(RF_DEG2RAD*(j * 360/slices)));

            rf_gfx_vertex3f(cosf(RF_DEG2RAD*(270+(180/(rings + 1))*i))*sinf(RF_DEG2RAD*(j * 360/slices)),
                           sinf(RF_DEG2RAD*(270+(180/(rings + 1))*i)),
                           cosf(RF_DEG2RAD*(270+(180/(rings + 1))*i))*cosf(RF_DEG2RAD*(j * 360/slices)));
        }
    }

    rf_gfx_end();
    rf_gfx_pop_matrix();
}